

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 BlobPrepareGrow(SyBlob *pBlob,sxu32 *pByte)

{
  void *pvVar1;
  void *pNew;
  sxu32 nByte;
  sxu32 *pByte_local;
  SyBlob *pBlob_local;
  
  pNew._4_4_ = *pByte;
  if ((pBlob->nFlags & 3) == 0) {
    if ((pBlob->nFlags & 4) != 0) {
      if (pBlob->nByte == 0) {
        pBlob->pBlob = (void *)0x0;
        pBlob->mByte = 0;
      }
      else {
        pvVar1 = SyMemBackendDup(pBlob->pAllocator,pBlob->pBlob,pBlob->nByte);
        if (pvVar1 == (void *)0x0) {
          return -1;
        }
        pBlob->pBlob = pvVar1;
        pBlob->mByte = pBlob->nByte;
      }
      pBlob->nFlags = pBlob->nFlags & 0xfffffffb;
    }
    if (pBlob->mByte - pBlob->nByte < pNew._4_4_) {
      if (pBlob->mByte == 0) {
        if (pNew._4_4_ < 0x10) {
          pNew._4_4_ = 0x10;
        }
      }
      else {
        pNew._4_4_ = pNew._4_4_ + pBlob->mByte * 2 + 0x10;
      }
      pvVar1 = SyMemBackendRealloc(pBlob->pAllocator,pBlob->pBlob,pNew._4_4_);
      if (pvVar1 == (void *)0x0) {
        pBlob_local._4_4_ = -1;
      }
      else {
        pBlob->pBlob = pvVar1;
        pBlob->mByte = pNew._4_4_;
        pBlob_local._4_4_ = 0;
      }
    }
    else {
      pBlob_local._4_4_ = 0;
    }
  }
  else if ((pBlob->mByte - pBlob->nByte < pNew._4_4_) &&
          (*pByte = pBlob->mByte - pBlob->nByte, *pByte == 0)) {
    pBlob_local._4_4_ = -0x1d;
  }
  else {
    pBlob_local._4_4_ = 0;
  }
  return pBlob_local._4_4_;
}

Assistant:

static sxi32 BlobPrepareGrow(SyBlob *pBlob, sxu32 *pByte)
{
	sxu32 nByte;
	void *pNew;
	nByte = *pByte;
	if( pBlob->nFlags & (SXBLOB_LOCKED|SXBLOB_STATIC) ){
		if ( SyBlobFreeSpace(pBlob) < nByte ){
			*pByte = SyBlobFreeSpace(pBlob);
			if( (*pByte) == 0 ){
				return SXERR_SHORT;
			}
		}
		return SXRET_OK;
	}
	if( pBlob->nFlags & SXBLOB_RDONLY ){
		/* Make a copy of the read-only item */
		if( pBlob->nByte > 0 ){
			pNew = SyMemBackendDup(pBlob->pAllocator, pBlob->pBlob, pBlob->nByte);
			if( pNew == 0 ){
				return SXERR_MEM;
			}
			pBlob->pBlob = pNew;
			pBlob->mByte = pBlob->nByte;
		}else{
			pBlob->pBlob = 0;
			pBlob->mByte = 0;
		}
		/* Remove the read-only flag */
		pBlob->nFlags &= ~SXBLOB_RDONLY;
	}
	if( SyBlobFreeSpace(pBlob) >= nByte ){
		return SXRET_OK;
	}
	if( pBlob->mByte > 0 ){
		nByte = nByte + pBlob->mByte * 2 + SXBLOB_MIN_GROWTH;
	}else if ( nByte < SXBLOB_MIN_GROWTH ){
		nByte = SXBLOB_MIN_GROWTH;
	}
	pNew = SyMemBackendRealloc(pBlob->pAllocator, pBlob->pBlob, nByte);
	if( pNew == 0 ){
		return SXERR_MEM;
	}
	pBlob->pBlob = pNew;
	pBlob->mByte = nByte;
	return SXRET_OK;
}